

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

int __thiscall
kj::UnixEventPort::poll(UnixEventPort *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  SignalPromiseAdapter *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined7 extraout_var;
  SignalPromiseAdapter **ppSVar5;
  int n;
  Fault f_4;
  Fault f_3;
  timespec local_188;
  Fault f;
  epoll_event events [16];
  
  this->sleeping = false;
  if ((this->childSet).ptr.ptr != (ChildSet *)0x0 || this->signalHead != (SignalPromiseAdapter *)0x0
     ) {
    ppSVar5 = &this->signalHead;
    do {
      iVar3 = sigemptyset((sigset_t *)events);
      if (-1 < iVar3) goto LAB_003efa87;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x2af,iVar3,"sigemptyset(&sigset)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_003efa87:
    iVar3 = 0;
    while (pSVar1 = *ppSVar5, pSVar1 != (SignalPromiseAdapter *)0x0) {
      do {
        iVar4 = sigaddset((sigset_t *)events,pSVar1->signum);
        if (-1 < iVar4) goto LAB_003efabb;
        iVar4 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar4 == -1);
      if (iVar4 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2b5,iVar4,"sigaddset(&sigset, ptr->signum)","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_003efabb:
      iVar3 = iVar3 + 1;
      ppSVar5 = &pSVar1->next;
    }
    if ((this->childSet).ptr.ptr != (ChildSet *)0x0) {
      do {
        iVar4 = sigaddset((sigset_t *)events,0x11);
        if (-1 < iVar4) goto LAB_003efafb;
        iVar4 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar4 == -1);
      if (iVar4 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2ba,iVar4,"sigaddset(&sigset, SIGCHLD)","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_003efafb:
      iVar3 = iVar3 + 1;
    }
LAB_003efb13:
    do {
      bVar2 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar2) break;
      local_188.tv_sec = 0;
      local_188.tv_nsec = 0;
      do {
        n = sigtimedwait((sigset_t *)events,(siginfo_t *)&f,&local_188);
        if (-1 < n) goto LAB_003efb5b;
        iVar4 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar4 == -1);
      if (iVar4 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2c7,iVar4,"n = sigtimedwait(&sigset, &siginfo, &timeout)","");
        kj::_::Debug::Fault::fatal(&f_3);
      }
      if (n < 0) break;
LAB_003efb5b:
      f_3.exception = (Exception *)&n;
      if (n != (int)f.exception) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
                  (&f_4,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2ca,FAILED,"n == siginfo.si_signo","_kjCondition,",
                   (DebugComparison<int_&,_int_&> *)&f_3);
        kj::_::Debug::Fault::fatal(&f_4);
      }
      gotSignal(this,(siginfo_t *)&f);
      do {
        iVar4 = sigdelset((sigset_t *)events,n);
        if (-1 < iVar4) goto LAB_003efb13;
        iVar4 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar4 == -1);
      if (iVar4 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                   ,0x2cf,iVar4,"sigdelset(&sigset, n)","");
        kj::_::Debug::Fault::fatal(&f_3);
      }
    } while( true );
  }
  do {
    iVar3 = epoll_wait((this->epollFd).fd,(epoll_event *)events,0x10,0);
    if (-1 < iVar3) goto LAB_003efa30;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x2d6,iVar4,"n = epoll_wait(epollFd, events, kj::size(events), 0)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_003efa30:
  bVar2 = processEpollEvents(this,events,iVar3);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool UnixEventPort::poll() {
  // Unfortunately, epoll_pwait() with a timeout of zero will never deliver actually deliver any
  // pending signals. Therefore, we need a completely different approach to poll for signals. We
  // might as well use regular epoll_wait() in this case, too, to save the kernel some effort.

  sleeping = false;

  if (signalHead != nullptr || childSet != kj::none) {
    // Use sigtimedwait() to poll for signals.

    // Construct a sigset of all signals we are interested in.
    sigset_t sigset;
    KJ_SYSCALL(sigemptyset(&sigset));
    uint count = 0;

    {
      auto ptr = signalHead;
      while (ptr != nullptr) {
        KJ_SYSCALL(sigaddset(&sigset, ptr->signum));
        ++count;
        ptr = ptr->next;
      }
      if (childSet != kj::none) {
        KJ_SYSCALL(sigaddset(&sigset, SIGCHLD));
        ++count;
      }
    }

    // While that set is non-empty, poll for signals.
    while (count > 0) {
      struct timespec timeout;
      timeout.tv_sec = 0;
      timeout.tv_nsec = 0;

      siginfo_t siginfo;
      int n;
      KJ_NONBLOCKING_SYSCALL(n = sigtimedwait(&sigset, &siginfo, &timeout));
      if (n < 0) break;  // EAGAIN: no signals in set are raised

      KJ_ASSERT(n == siginfo.si_signo);
      gotSignal(siginfo);

      // Remove that signal from the set so we don't receive it again, but keep checking for others
      // if there are any.
      KJ_SYSCALL(sigdelset(&sigset, n));
      --count;
    }
  }

  struct epoll_event events[16];
  int n;
  KJ_SYSCALL(n = epoll_wait(epollFd, events, kj::size(events), 0));

  return processEpollEvents(events, n);
}